

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::Reshape::backward_impl
          (Reshape *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor reshaped;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> MStack_98;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_78;
  undefined1 local_58 [48];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_28;
  
  local_58._32_4_ = (dEdxi->d).bd;
  local_58._40_8_ = dEdf->v;
  local_58._0_8_ = *(undefined8 *)(dEdxi->d).d;
  local_58._8_8_ = *(undefined8 *)((dEdxi->d).d + 2);
  local_58._16_8_ = *(undefined8 *)((dEdxi->d).d + 4);
  local_58._24_8_ = *(undefined8 *)((dEdxi->d).d + 6);
  local_28.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  Tensor::operator*(&local_78,(Tensor *)local_58);
  Tensor::operator*(&MStack_98,dEdxi);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator+=
            ((MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>> *)
             &MStack_98,
             (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_78);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_28);
  return;
}

Assistant:

void Reshape::backward_impl(const vector<const Tensor*>& xs,
                            const Tensor& fx,
                            const Tensor& dEdf,
                            unsigned i,
                            Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Reshape not yet implemented for CUDA");
#else
  const Tensor reshaped(dEdxi.d, dEdf.v);
  *dEdxi += *reshaped;
#endif
}